

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
ProbabEstimator::getProbabGt
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  
  dVar8 = DistribFunction::getDistrib(this->distribFunction,minValInRetained);
  auVar6._0_8_ = 1.0;
  if (-1 < numReplaced) {
    auVar12 = ZEXT816(0x3ff0000000000000);
    dVar13 = 0.0;
    auVar14 = auVar12;
    uVar1 = 0;
    do {
      uVar2 = pathLength - uVar1;
      auVar11 = ZEXT1664(auVar12);
      if ((double)(int)uVar2 + 0.5 < (double)pathLength) {
        auVar11 = ZEXT1664(auVar12);
        auVar6._0_8_ = (double)pathLength;
        do {
          auVar11 = ZEXT864((ulong)(auVar6._0_8_ * auVar11._0_8_));
          auVar6._0_8_ = auVar6._0_8_ + -1.0;
        } while ((double)(int)uVar2 + 0.5 < auVar6._0_8_);
      }
      dVar9 = auVar11._0_8_;
      auVar6._0_8_ = dVar13;
      if (1 < uVar1) {
        do {
          dVar9 = auVar11._0_8_ / auVar6._0_8_;
          auVar11 = ZEXT1664(CONCAT88(auVar11._8_8_,dVar9));
          auVar6._0_8_ = auVar6._0_8_ + -1.0;
        } while (1.0 < auVar6._0_8_);
      }
      auVar6._0_8_ = 1.0;
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        auVar10 = auVar12;
        dVar15 = 1.0 - dVar8;
        do {
          auVar6._0_8_ = dVar15 * auVar10._0_8_;
          dVar15 = dVar15 * dVar15;
          auVar6._0_8_ = (double)((ulong)((byte)uVar4 & 1) * (long)auVar6._0_8_ +
                                 (ulong)!(bool)((byte)uVar4 & 1) * (long)auVar10._0_8_);
          auVar6._8_8_ = auVar10._8_8_;
          uVar3 = (uint)uVar4;
          uVar4 = uVar4 >> 1;
          auVar10 = auVar6;
        } while (1 < uVar3);
      }
      auVar7 = auVar12;
      auVar10 = auVar12;
      dVar15 = dVar8;
      if (uVar2 != 0) {
        do {
          auVar7._0_8_ = (ulong)((byte)uVar2 & 1) * (long)(dVar15 * auVar10._0_8_) +
                         (ulong)!(bool)((byte)uVar2 & 1) * (long)auVar10._0_8_;
          auVar7._8_8_ = auVar10._8_8_;
          bVar5 = 1 < uVar2;
          uVar2 = (int)uVar2 >> 1;
          auVar10 = auVar7;
          dVar15 = dVar15 * dVar15;
        } while (bVar5);
      }
      dVar13 = dVar13 + 1.0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar6._0_8_ * dVar9;
      auVar14 = vfnmadd213sd_fma(auVar10,auVar7,auVar14);
      auVar6._0_8_ = auVar14._0_8_;
      bVar5 = uVar1 != numReplaced;
      uVar1 = uVar1 + 1;
    } while (bVar5);
  }
  return auVar6._0_8_;
}

Assistant:

double ProbabEstimator::getProbabGt( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib(minValInRetained);
    double cPAr = 1.0-PAr;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){
        val -= (double)combNumber( pathLength, i )*pown( cPAr, i )*pown(PAr, (pathLength-i));
    }

    return val;
}